

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int check_7zip_header_in_sfx(char *p)

{
  byte bVar1;
  int iVar2;
  uLong uVar3;
  
  bVar1 = p[5];
  if (bVar1 < 0x7a) {
    if (bVar1 == 0x1c) {
      iVar2 = 6;
      if (*(short *)(p + 4) == 0x1c27 && *(int *)p == -0x504385c9) {
        uVar3 = cm_zlib_z_crc32(0,(uchar *)(p + 0xc),0x14);
        iVar2 = 6;
        if (uVar3 == *(uint *)(p + 8)) {
          iVar2 = 0;
        }
      }
      return iVar2;
    }
    if (bVar1 == 0x27) {
      return 1;
    }
    if (bVar1 == 0x37) {
      return 5;
    }
  }
  else {
    if (bVar1 == 0x7a) {
      return 4;
    }
    if (bVar1 == 0xaf) {
      return 2;
    }
    if (bVar1 == 0xbc) {
      return 3;
    }
  }
  return 6;
}

Assistant:

static int
check_7zip_header_in_sfx(const char *p)
{
	switch ((unsigned char)p[5]) {
	case 0x1C:
		if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0)
			return (6);
		/*
		 * Test the CRC because its extraction code has 7-Zip
		 * Magic Code, so we should do this in order not to
		 * make a mis-detection.
		 */
		if (crc32(0, (const unsigned char *)p + 12, 20)
			!= archive_le32dec(p + 8))
			return (6);
		/* Hit the header! */
		return (0);
	case 0x37: return (5);
	case 0x7A: return (4);
	case 0xBC: return (3);
	case 0xAF: return (2);
	case 0x27: return (1);
	default: return (6);
	}
}